

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O2

void __thiscall Liby::UdpSocket::handleConnectEvent(UdpSocket *this,Endpoint *ep)

{
  iterator iVar1;
  shared_ptr<Liby::UdpConnection> uconn;
  shared_ptr<Liby::UdpConnection> local_50;
  pair<Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_> local_40;
  
  iVar1 = std::
          _Rb_tree<Liby::Endpoint,_std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>,_std::_Select1st<std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>_>,_std::less<Liby::Endpoint>,_std::allocator<std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>_>_>
          ::find(&(this->conns_)._M_t,ep);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->conns_)._M_t._M_impl.super__Rb_tree_header) {
    local_40.first = (Endpoint)this;
    std::make_shared<Liby::UdpConnection,Liby::UdpSocket*,Liby::Endpoint_const&>
              ((UdpSocket **)&local_50,&local_40.first);
    std::pair<Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>::
    pair<std::shared_ptr<Liby::UdpConnection>_&,_true>(&local_40,ep,&local_50);
    std::
    _Rb_tree<Liby::Endpoint,std::pair<Liby::Endpoint_const,std::shared_ptr<Liby::UdpConnection>>,std::_Select1st<std::pair<Liby::Endpoint_const,std::shared_ptr<Liby::UdpConnection>>>,std::less<Liby::Endpoint>,std::allocator<std::pair<Liby::Endpoint_const,std::shared_ptr<Liby::UdpConnection>>>>
    ::_M_emplace_unique<std::pair<Liby::Endpoint,std::shared_ptr<Liby::UdpConnection>>>
              ((_Rb_tree<Liby::Endpoint,std::pair<Liby::Endpoint_const,std::shared_ptr<Liby::UdpConnection>>,std::_Select1st<std::pair<Liby::Endpoint_const,std::shared_ptr<Liby::UdpConnection>>>,std::less<Liby::Endpoint>,std::allocator<std::pair<Liby::Endpoint_const,std::shared_ptr<Liby::UdpConnection>>>>
                *)&this->conns_,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_40.second.super___shared_ptr<Liby::UdpConnection,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if ((this->connectorCallback_).super__Function_base._M_manager != (_Manager_type)0x0) {
      std::function<void_(Liby::UdpConnection_&)>::operator()
                (&this->connectorCallback_,
                 local_50.super___shared_ptr<Liby::UdpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                );
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_50.super___shared_ptr<Liby::UdpConnection,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return;
}

Assistant:

void UdpSocket::handleConnectEvent(const Endpoint &ep) {
    auto it = conns_.find(ep);
    if (it != conns_.end())
        return;

    auto uconn = std::make_shared<UdpConnection>(this, ep);
    conns_.insert(std::make_pair(ep, uconn));
    if (connectorCallback_) {
        connectorCallback_(*uconn);
    }
}